

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratchecker.cpp
# Opt level: O2

void __thiscall CaDiCaL::LratChecker::insert(LratChecker *this)

{
  int64_t *piVar1;
  LratCheckerClause **ppLVar2;
  uint64_t uVar3;
  LratCheckerClause *pLVar4;
  uint64_t hash;
  
  piVar1 = &(this->stats).insertions;
  *piVar1 = *piVar1 + 1;
  uVar3 = this->size_clauses;
  if (this->num_clauses == uVar3) {
    enlarge_clauses(this);
    uVar3 = this->size_clauses;
  }
  hash = this->last_id * this->nonces[(uint)this->last_id & 3];
  this->last_hash = hash;
  uVar3 = reduce_hash(hash,uVar3);
  pLVar4 = new_clause(this);
  ppLVar2 = this->clauses;
  pLVar4->next = ppLVar2[uVar3];
  ppLVar2[uVar3] = pLVar4;
  return;
}

Assistant:

void LratChecker::insert () {
  stats.insertions++;
  if (num_clauses == size_clauses)
    enlarge_clauses ();
  const uint64_t h = reduce_hash (compute_hash (last_id), size_clauses);
  LratCheckerClause *c = new_clause ();
  c->next = clauses[h];
  clauses[h] = c;
}